

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O1

void __thiscall Rml::Context::UnloadDocument(Context *this,ElementDocument *_document)

{
  ulong uVar1;
  Element **__src;
  pointer *pppEVar2;
  pointer puVar3;
  Element **ppEVar4;
  long lVar5;
  ulong uVar6;
  Element *pEVar7;
  __normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  __dest;
  ElementDocument *pEVar8;
  ulong uVar9;
  bool bVar10;
  ElementDocument *document;
  ElementDocument *local_40;
  undefined1 local_38 [32];
  
  puVar3 = (this->unloaded_documents).
           super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->unloaded_documents).
                super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3;
  bVar10 = lVar5 != 0;
  if (bVar10) {
    uVar6 = lVar5 >> 3;
    if ((_Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>)
        (puVar3->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t !=
        (_Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>)_document) {
      uVar9 = 0;
      do {
        if ((uVar6 + (uVar6 == 0)) - 1 == uVar9) goto LAB_001e8d9b;
        uVar1 = uVar9 + 1;
        lVar5 = uVar9 + 1;
        uVar9 = uVar1;
      } while ((_Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>)
               puVar3[lVar5]._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
               _M_t != (_Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>)_document);
      bVar10 = uVar1 < uVar6;
    }
    if (bVar10) {
      return;
    }
  }
LAB_001e8d9b:
  local_40 = _document;
  pEVar7 = Element::GetParentNode(&_document->super_Element);
  if (pEVar7 == (this->root)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
                _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl) {
    local_38._0_8_ = (_func_int **)0x0;
    local_38._8_8_ = (pointer)0x0;
    local_38._16_8_ = (pointer)0x0;
    Element::DispatchEvent(&local_40->super_Element,Unload,(Dictionary *)local_38);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
               *)local_38);
    PluginRegistry::NotifyDocumentUnload(local_40);
    Element::RemoveChild
              ((Element *)local_38,
               (this->root)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
               _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
               super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl);
    ::std::
    vector<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>,std::allocator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>>>
    ::emplace_back<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>>
              ((vector<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>,std::allocator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>>>
                *)&this->unloaded_documents,
               (unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)local_38);
    if ((pointer)local_38._0_8_ != (pointer)0x0) {
      (**(code **)(*(_func_int **)local_38._0_8_ + 0x10))();
    }
  }
  __dest = ::std::
           __find_if<__gnu_cxx::__normal_iterator<Rml::Element**,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>,__gnu_cxx::__ops::_Iter_equals_val<Rml::ElementDocument*const>>
                     ((this->document_focus_history).
                      super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (this->document_focus_history).
                      super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
                      super__Vector_impl_data._M_finish,&local_40);
  ppEVar4 = (this->document_focus_history).
            super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (__dest._M_current != ppEVar4) {
    __src = __dest._M_current + 1;
    if (__src != ppEVar4) {
      memmove(__dest._M_current,__src,(long)ppEVar4 - (long)__src);
    }
    pppEVar2 = &(this->document_focus_history).
                super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppEVar2 = *pppEVar2 + -1;
  }
  if ((this->focus != (Element *)0x0) &&
     (pEVar8 = Element::GetOwnerDocument(this->focus), pEVar8 == local_40)) {
    this->focus = (Element *)0x0;
    pEVar7 = Element::GetFocusLeafNode
                       ((this->document_focus_history).
                        super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
                        super__Vector_impl_data._M_finish[-1]);
    Element::Focus(pEVar7,false);
  }
  if ((this->active != (Element *)0x0) &&
     (pEVar8 = Element::GetOwnerDocument(this->active), pEVar8 == local_40)) {
    this->active = (Element *)0x0;
  }
  if ((this->drag != (Element *)0x0) &&
     (pEVar8 = Element::GetOwnerDocument(this->drag), pEVar8 == local_40)) {
    this->drag = (Element *)0x0;
    ReleaseDragClone(this);
  }
  if ((this->drag_hover != (Element *)0x0) &&
     (pEVar8 = Element::GetOwnerDocument(this->drag_hover), pEVar8 == local_40)) {
    this->drag_hover = (Element *)0x0;
  }
  UpdateHoverChain(this,this->mouse_position,0,(Dictionary *)0x0,(Dictionary *)0x0);
  return;
}

Assistant:

void Context::UnloadDocument(ElementDocument* _document)
{
	// Has this document already been unloaded?
	for (size_t i = 0; i < unloaded_documents.size(); ++i)
	{
		if (unloaded_documents[i].get() == _document)
			return;
	}

	ElementDocument* document = _document;

	if (document->GetParentNode() == root.get())
	{
		// Dispatch the unload notifications.
		document->DispatchEvent(EventId::Unload, Dictionary());
		PluginRegistry::NotifyDocumentUnload(document);

		// Move document to a temporary location to be released later.
		unloaded_documents.push_back(root->RemoveChild(document));
	}

	// Remove the item from the focus history.
	ElementList::iterator itr = std::find(document_focus_history.begin(), document_focus_history.end(), document);
	if (itr != document_focus_history.end())
		document_focus_history.erase(itr);

	// Focus to the previous document if the old document is the current focus.
	if (focus && focus->GetOwnerDocument() == document)
	{
		focus = nullptr;
		document_focus_history.back()->GetFocusLeafNode()->Focus();
	}

	// Clear the active element if the old document is the active element.
	if (active && active->GetOwnerDocument() == document)
	{
		active = nullptr;
	}

	// Clear other pointers to elements whose owner was deleted
	if (drag && drag->GetOwnerDocument() == document)
	{
		drag = nullptr;
		ReleaseDragClone();
	}

	if (drag_hover && drag_hover->GetOwnerDocument() == document)
	{
		drag_hover = nullptr;
	}

	// Rebuild the hover state.
	UpdateHoverChain(mouse_position);
}